

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O1

void I_GetAxes(float *axes)

{
  SDLInputJoystickManager *pSVar1;
  ulong uVar2;
  
  axes[0] = 0.0;
  axes[1] = 0.0;
  axes[2] = 0.0;
  axes[3] = 0.0;
  axes[4] = 0.0;
  pSVar1 = JoystickManager;
  if ((use_joystick.Value == true) && ((JoystickManager->Joysticks).Count != 0)) {
    uVar2 = 0;
    do {
      SDLInputJoystick::AddAxes((pSVar1->Joysticks).Array[uVar2],axes);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (pSVar1->Joysticks).Count);
  }
  return;
}

Assistant:

void I_GetAxes(float axes[NUM_JOYAXIS])
{
	for (int i = 0; i < NUM_JOYAXIS; ++i)
	{
		axes[i] = 0;
	}
	if (use_joystick)
	{
		JoystickManager->AddAxes(axes);
	}
}